

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::LocalVarCheckVisitor::visit<slang::ast::DataTypeExpression>
          (LocalVarCheckVisitor *this,DataTypeExpression *expr)

{
  bool bVar1;
  Symbol *pSVar2;
  Expression *in_RSI;
  long in_RDI;
  undefined1 unaff_retaddr;
  Expression *in_stack_00000008;
  Visibility in_stack_0000001c;
  SubroutineSymbol *sub;
  CallExpression *call;
  Symbol *sym;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    bVar1 = ValueExpressionBase::isKind(in_RSI->kind);
    if (bVar1) {
      pSVar2 = Expression::getSymbolReference(in_stack_00000008,(bool)unaff_retaddr);
      if ((pSVar2 != (Symbol *)0x0) && (pSVar2->kind == ClassProperty)) {
        Symbol::as<slang::ast::ClassPropertySymbol>((Symbol *)0x529019);
        checkVisibility((LocalVarCheckVisitor *)sym,(Symbol *)call,(Expression *)sub,
                        in_stack_0000001c);
      }
    }
    else if (in_RSI->kind == Call) {
      Expression::as<slang::ast::CallExpression>(in_RSI);
      bVar1 = CallExpression::isSystemCall((CallExpression *)0x529058);
      if (!bVar1) {
        std::
        get<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                  ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    *)0x52906a);
        checkVisibility((LocalVarCheckVisitor *)sym,(Symbol *)call,(Expression *)sub,
                        in_stack_0000001c);
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if (anyErrors)
            return;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ValueExpressionBase::isKind(expr.kind)) {
                if (auto sym = expr.getSymbolReference();
                    sym && sym->kind == SymbolKind::ClassProperty) {
                    checkVisibility(*sym, expr, sym->template as<ClassPropertySymbol>().visibility);
                }
            }
            else if (expr.kind == ExpressionKind::Call) {
                auto& call = expr.template as<CallExpression>();
                if (!call.isSystemCall()) {
                    auto& sub = *std::get<const SubroutineSymbol*>(call.subroutine);
                    checkVisibility(sub, expr, sub.visibility);
                }
            }

            if constexpr (HasVisitExprs<T, LocalVarCheckVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }